

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::UniformCase::generateFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms)

{
  bool local_1ad;
  undefined1 local_1a0 [8];
  ostringstream result;
  bool isFragmentCase;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  local_1ad = true;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    local_1ad = this->m_caseShaderType == CASESHADERTYPE_BOTH;
  }
  result._375_1_ = local_1ad;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"varying mediump float v_vtxOut;\n\n");
  if ((result._375_1_ & 1) != 0) {
    writeUniformDefinitions(this,(ostringstream *)local_1a0);
  }
  std::operator<<((ostream *)local_1a0,"\nvoid main (void)\n{\n\tmediump float result = v_vtxOut;\n"
                 );
  if ((result._375_1_ & 1) != 0) {
    writeUniformComparisons(this,(ostringstream *)local_1a0,basicUniforms,"result");
  }
  std::operator<<((ostream *)local_1a0,"\tgl_FragColor = vec4(result, result, result, 1.0);\n}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string UniformCase::generateFragmentSource (const vector<BasicUniform>& basicUniforms) const
{
	const bool			isFragmentCase = m_caseShaderType == CASESHADERTYPE_FRAGMENT || m_caseShaderType == CASESHADERTYPE_BOTH;
	std::ostringstream	result;

	result << "varying mediump float v_vtxOut;\n"
			  "\n";

	if (isFragmentCase)
		writeUniformDefinitions(result);

	result << "\n"
			  "void main (void)\n"
			  "{\n"
			  "	mediump float result = v_vtxOut;\n";

	if (isFragmentCase)
		writeUniformComparisons(result, basicUniforms, "result");

	result << "	gl_FragColor = vec4(result, result, result, 1.0);\n"
			  "}\n";

	return result.str();
}